

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::UnitTestImpl::AddTestInfo
          (UnitTestImpl *this,SetUpTestSuiteFunc set_up_tc,TearDownTestSuiteFunc tear_down_tc,
          TestInfo *test_info)

{
  bool bVar1;
  ostream *poVar2;
  TestInfo *in_RCX;
  TestSuite *in_RDI;
  char *unaff_retaddr;
  GTestLogSeverity in_stack_0000000c;
  GTestLog *in_stack_00000010;
  TearDownTestSuiteFunc in_stack_000000a8;
  SetUpTestSuiteFunc in_stack_000000b0;
  char *in_stack_000000b8;
  string *in_stack_000000c0;
  UnitTestImpl *in_stack_000000c8;
  FilePath *in_stack_ffffffffffffff88;
  FilePath *in_stack_ffffffffffffff90;
  GTestLog *this_00;
  TestInfo *in_stack_ffffffffffffff98;
  GTestLog local_44 [9];
  TestInfo *local_20;
  TestSuite *pTVar3;
  int line;
  
  local_20 = in_RCX;
  pTVar3 = in_RDI;
  bVar1 = FilePath::IsEmpty((FilePath *)0x1675bb);
  line = (int)((ulong)pTVar3 >> 0x20);
  if (bVar1) {
    FilePath::GetCurrentDir();
    FilePath::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    FilePath::~FilePath((FilePath *)0x1675eb);
    bVar1 = FilePath::IsEmpty((FilePath *)0x1675f9);
    bVar1 = IsTrue((bool)((bVar1 ^ 0xffU) & 1));
    if (!bVar1) {
      this_00 = local_44;
      GTestLog::GTestLog(in_stack_00000010,in_stack_0000000c,unaff_retaddr,line);
      poVar2 = GTestLog::GetStream(this_00);
      in_stack_ffffffffffffff98 =
           (TestInfo *)std::operator<<(poVar2,"Condition !original_working_dir_.IsEmpty() failed. ")
      ;
      std::operator<<((ostream *)in_stack_ffffffffffffff98,
                      "Failed to get the current working directory.");
      GTestLog::~GTestLog(this_00);
    }
  }
  TestInfo::type_param(local_20);
  GetTestSuite(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,
               in_stack_000000a8);
  TestSuite::AddTestInfo(in_RDI,in_stack_ffffffffffffff98);
  return;
}

Assistant:

void AddTestInfo(internal::SetUpTestSuiteFunc set_up_tc,
                   internal::TearDownTestSuiteFunc tear_down_tc,
                   TestInfo* test_info) {
#if GTEST_HAS_FILE_SYSTEM
    // In order to support thread-safe death tests, we need to
    // remember the original working directory when the test program
    // was first invoked.  We cannot do this in RUN_ALL_TESTS(), as
    // the user may have changed the current directory before calling
    // RUN_ALL_TESTS().  Therefore we capture the current directory in
    // AddTestInfo(), which is called to register a TEST or TEST_F
    // before main() is reached.
    if (original_working_dir_.IsEmpty()) {
      original_working_dir_ = FilePath::GetCurrentDir();
      GTEST_CHECK_(!original_working_dir_.IsEmpty())
          << "Failed to get the current working directory.";
    }
#endif  // GTEST_HAS_FILE_SYSTEM

    GetTestSuite(test_info->test_suite_name_, test_info->type_param(),
                 set_up_tc, tear_down_tc)
        ->AddTestInfo(test_info);
  }